

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepCompositing.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepCompositing::composite_pixel
          (DeepCompositing *this,float *outputs,float **inputs,char **channel_names,int num_channels
          ,int num_samples,int sources)

{
  float fVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar11;
  vector<int,_std::allocator<int>_> sort_order;
  undefined1 local_58 [16];
  pointer local_48;
  char **local_40;
  DeepCompositing *local_38;
  
  local_38 = this;
  if (0 < num_channels) {
    memset(outputs,0,(ulong)(uint)num_channels * 4);
  }
  if (num_samples != 0) {
    local_58 = (undefined1  [16])0x0;
    local_48 = (pointer)0x0;
    local_40 = channel_names;
    if (1 < sources) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_58,(long)num_samples);
      auVar4 = _DAT_0034b180;
      auVar3 = _DAT_001661b0;
      if (0 < num_samples) {
        lVar5 = (ulong)(uint)num_samples - 1;
        auVar8._8_4_ = (int)lVar5;
        auVar8._0_8_ = lVar5;
        auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
        uVar6 = 0;
        auVar8 = auVar8 ^ _DAT_001661b0;
        auVar10 = _DAT_001681a0;
        do {
          bVar2 = auVar8._0_4_ < SUB164(auVar10 ^ auVar3,0);
          iVar9 = auVar8._4_4_;
          iVar11 = SUB164(auVar10 ^ auVar3,4);
          if ((bool)(~(iVar9 < iVar11 || iVar11 == iVar9 && bVar2) & 1)) {
            *(int *)(local_58._0_8_ + uVar6 * 4) = (int)uVar6;
          }
          if (iVar9 >= iVar11 && (iVar11 != iVar9 || !bVar2)) {
            *(int *)(local_58._0_8_ + (uVar6 + 1) * 4) = (int)uVar6 + 1;
          }
          uVar6 = uVar6 + 2;
          lVar5 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + auVar4._0_8_;
          auVar10._8_8_ = lVar5 + auVar4._8_8_;
        } while ((num_samples + 1U & 0xfffffffe) != uVar6);
      }
      (*local_38->_vptr_DeepCompositing[3])
                (local_38,local_58._0_8_,inputs,local_40,num_channels,(ulong)(uint)num_samples,
                 sources);
    }
    if (0 < num_samples) {
      uVar6 = 0;
      while( true ) {
        iVar9 = (int)uVar6;
        if (1 < sources) {
          iVar9 = *(int *)(local_58._0_8_ + uVar6 * 4);
        }
        fVar1 = outputs[2];
        if (1.0 <= fVar1) break;
        if (0 < num_channels) {
          uVar7 = 0;
          do {
            outputs[uVar7] = outputs[uVar7] + inputs[uVar7][iVar9] * (1.0 - fVar1);
            uVar7 = uVar7 + 1;
          } while ((uint)num_channels != uVar7);
        }
        if ((1.0 <= fVar1) || (uVar6 = uVar6 + 1, uVar6 == (uint)num_samples)) break;
      }
    }
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
    }
  }
  return;
}

Assistant:

void 
DeepCompositing::composite_pixel (float outputs[],
                                  const float* inputs[],
                                  const char*channel_names[],
                                  int num_channels,
                                  int num_samples,
                                  int sources)
{
    for(int i=0;i<num_channels;i++) outputs[i]=0.0;
    // no samples? do nothing
   if(num_samples==0)
   {
       return;
   }
   
   vector<int> sort_order;
   if(sources>1)
   {
       sort_order.resize(num_samples);
       for(int i=0;i<num_samples;i++) sort_order[i]=i;
       sort(&sort_order[0],inputs,channel_names,num_channels,num_samples,sources);
   }
   
   
   for(int i=0;i<num_samples;i++)
   {
       int s=(sources>1) ? sort_order[i] : i;
       float alpha=outputs[2]; 
       if(alpha>=1.0) return;
       
       for(int c=0;c<num_channels;c++)
       {
           outputs[c]+=(1.0-alpha)*inputs[c][s];
       }
   }   
}